

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O2

string * __thiscall
anon_unknown.dwarf_b40955::EvaluateSplitConfigGenex
          (string *__return_storage_ptr__,anon_unknown_dwarf_b40955 *this,string_view input,
          cmGeneratorExpression *ge,cmLocalGenerator *lg,bool useOutputConfig,string *outputConfig,
          string *commandConfig,cmGeneratorTarget *target,
          set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
          *utils)

{
  bool bVar1;
  int iVar2;
  size_type __n;
  string *psVar3;
  _Rb_tree_node_base *p_Var4;
  long lVar5;
  _Rb_tree_node_base *p_Var6;
  ulong __pos;
  string_view prefix;
  string_view prefix_00;
  basic_string_view<char,_std::char_traits<char>_> str;
  undefined7 in_stack_00000009;
  uint local_104;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  string *local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  cmLocalGenerator *local_d0;
  string *local_c8;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0 [2];
  string local_78 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_58;
  
  local_c8 = (string *)input._M_str;
  local_104 = (uint)lg;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  local_e0._M_str = (char *)input._M_len;
  local_e0._M_len = (size_t)this;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_e8 = __return_storage_ptr__;
  local_d0 = (cmLocalGenerator *)ge;
  do {
    if (this == (anon_unknown_dwarf_b40955 *)0x0) {
      return local_e8;
    }
    __n = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_e0,"$<",0);
    local_b0 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_e0,0,__n);
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)local_e8,&local_b0);
    if (__n == 0xffffffffffffffff) {
      return local_e8;
    }
    local_e0 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_e0,__n,0xffffffffffffffff);
    lVar5 = 1;
    for (__pos = 2; __pos < local_e0._M_len; __pos = __pos + 1) {
      str = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&local_e0,__pos,0xffffffffffffffff);
      bVar1 = cmHasLiteralPrefix<3ul>(str,(char (*) [3])0x5b7090);
      if (bVar1) {
        lVar5 = lVar5 + 1;
        __pos = __pos + 1;
      }
      else {
        bVar1 = cmHasLiteralPrefix<2ul>(str,(char (*) [2])0x5a89c8);
        if ((bVar1) && (lVar5 = lVar5 + -1, lVar5 == 0)) {
          __pos = __pos + 1;
          bVar1 = true;
          goto LAB_0028933d;
        }
      }
    }
    bVar1 = lVar5 == 0;
LAB_0028933d:
    local_f8 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_e0,0,__pos);
    local_e0 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_e0,__pos,0xffffffffffffffff);
    psVar3 = outputConfig;
    if ((local_104 & 1) != 0) {
      psVar3 = (string *)CONCAT71(in_stack_00000009,useOutputConfig);
    }
    if (bVar1) {
      if (((anonymous_namespace)::
           EvaluateSplitConfigGenex(std::basic_string_view<char,std::char_traits<char>>,cmGeneratorExpression_const&,cmLocalGenerator*,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*,std::set<BT<std::pair<std::__cxx11::string,bool>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>*)
           ::COMMAND_CONFIG == '\0') &&
         (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                       EvaluateSplitConfigGenex(std::basic_string_view<char,std::char_traits<char>>,cmGeneratorExpression_const&,cmLocalGenerator*,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*,std::set<BT<std::pair<std::__cxx11::string,bool>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>*)
                                       ::COMMAND_CONFIG), iVar2 != 0)) {
        EvaluateSplitConfigGenex::COMMAND_CONFIG._M_len = 0x11;
        EvaluateSplitConfigGenex::COMMAND_CONFIG._M_str = "$<COMMAND_CONFIG:";
        __cxa_guard_release(&(anonymous_namespace)::
                             EvaluateSplitConfigGenex(std::basic_string_view<char,std::char_traits<char>>,cmGeneratorExpression_const&,cmLocalGenerator*,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*,std::set<BT<std::pair<std::__cxx11::string,bool>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>*)
                             ::COMMAND_CONFIG);
      }
      if (((anonymous_namespace)::
           EvaluateSplitConfigGenex(std::basic_string_view<char,std::char_traits<char>>,cmGeneratorExpression_const&,cmLocalGenerator*,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*,std::set<BT<std::pair<std::__cxx11::string,bool>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>*)
           ::OUTPUT_CONFIG == '\0') &&
         (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                       EvaluateSplitConfigGenex(std::basic_string_view<char,std::char_traits<char>>,cmGeneratorExpression_const&,cmLocalGenerator*,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*,std::set<BT<std::pair<std::__cxx11::string,bool>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>*)
                                       ::OUTPUT_CONFIG), iVar2 != 0)) {
        EvaluateSplitConfigGenex::OUTPUT_CONFIG._M_len = 0x10;
        EvaluateSplitConfigGenex::OUTPUT_CONFIG._M_str = "$<OUTPUT_CONFIG:";
        __cxa_guard_release(&(anonymous_namespace)::
                             EvaluateSplitConfigGenex(std::basic_string_view<char,std::char_traits<char>>,cmGeneratorExpression_const&,cmLocalGenerator*,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*,std::set<BT<std::pair<std::__cxx11::string,bool>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>*)
                             ::OUTPUT_CONFIG);
      }
      prefix._M_str = EvaluateSplitConfigGenex::COMMAND_CONFIG._M_str;
      prefix._M_len = EvaluateSplitConfigGenex::COMMAND_CONFIG._M_len;
      bVar1 = cmHasPrefix(local_f8,prefix);
      if (bVar1) {
        local_f8._M_str = local_f8._M_str + EvaluateSplitConfigGenex::COMMAND_CONFIG._M_len;
        local_f8._M_len =
             (long)(_func_int ***)local_f8._M_len + ~EvaluateSplitConfigGenex::COMMAND_CONFIG._M_len
        ;
        local_104 = 0;
        psVar3 = outputConfig;
      }
      else {
        prefix_00._M_str = EvaluateSplitConfigGenex::OUTPUT_CONFIG._M_str;
        prefix_00._M_len = EvaluateSplitConfigGenex::OUTPUT_CONFIG._M_len;
        bVar1 = cmHasPrefix(local_f8,prefix_00);
        if (bVar1) {
          local_f8._M_str = local_f8._M_str + EvaluateSplitConfigGenex::OUTPUT_CONFIG._M_len;
          local_f8._M_len =
               (long)(_func_int ***)local_f8._M_len +
               ~EvaluateSplitConfigGenex::OUTPUT_CONFIG._M_len;
          local_104 = 1;
          psVar3 = (string *)CONCAT71(in_stack_00000009,useOutputConfig);
        }
      }
    }
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_78,&local_f8,(allocator<char> *)&local_b0);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,local_c8);
    std::__cxx11::string::~string(local_78);
    local_b0._M_str = (char *)0x0;
    local_b0._M_len = (size_t)local_a0;
    local_a0[0]._M_local_buf[0] = '\0';
    cmCompiledGeneratorExpression::Evaluate
              ((cmCompiledGeneratorExpression *)
               cge._M_t.
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,local_d0,
               psVar3,(cmGeneratorTarget *)commandConfig,(cmGeneratorExpressionDAGChecker *)0x0,
               (cmGeneratorTarget *)0x0,(string *)&local_b0);
    std::__cxx11::string::append((string *)local_e8);
    std::__cxx11::string::~string((string *)&local_b0);
    if (target != (cmGeneratorTarget *)0x0) {
      p_Var6 = (_Rb_tree_node_base *)
               ((long)cge._M_t.
                      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl +
               0x58);
      for (p_Var4 = *(_Rb_tree_node_base **)
                     ((long)cge._M_t.
                            super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                            .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                            _M_head_impl + 0x68); p_Var4 != p_Var6;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(*(cmGeneratorTarget **)(p_Var4 + 1));
        std::__cxx11::string::string((string *)&local_58,(string *)psVar3);
        local_58.second = (bool)(~(byte)local_104 & 1);
        std::
        __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr(&local_c0,
                       (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        *)cge._M_t.
                          super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                          .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                          _M_head_impl);
        BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
        ::BT((BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
              *)&local_b0,&local_58,(cmListFileBacktrace *)&local_c0);
        std::
        _Rb_tree<BT<std::pair<std::__cxx11::string,bool>>,BT<std::pair<std::__cxx11::string,bool>>,std::_Identity<BT<std::pair<std::__cxx11::string,bool>>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>
        ::_M_emplace_unique<BT<std::pair<std::__cxx11::string,bool>>>
                  ((_Rb_tree<BT<std::pair<std::__cxx11::string,bool>>,BT<std::pair<std::__cxx11::string,bool>>,std::_Identity<BT<std::pair<std::__cxx11::string,bool>>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>
                    *)target,
                   (BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                    *)&local_b0);
        BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
        ::~BT((BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
               *)&local_b0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
        std::__cxx11::string::~string((string *)&local_58);
      }
    }
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr(&cge);
    this = (anon_unknown_dwarf_b40955 *)local_e0._M_len;
  } while( true );
}

Assistant:

std::string EvaluateSplitConfigGenex(
  cm::string_view input, cmGeneratorExpression const& ge, cmLocalGenerator* lg,
  bool useOutputConfig, std::string const& outputConfig,
  std::string const& commandConfig, cmGeneratorTarget const* target,
  std::set<BT<std::pair<std::string, bool>>>* utils = nullptr)
{
  std::string result;

  while (!input.empty()) {
    // Copy non-genex content directly to the result.
    std::string::size_type pos = input.find("$<");
    result += input.substr(0, pos);
    if (pos == std::string::npos) {
      break;
    }
    input = input.substr(pos);

    // Find the balanced end of this regex.
    size_t nestingLevel = 1;
    for (pos = 2; pos < input.size(); ++pos) {
      cm::string_view cur = input.substr(pos);
      if (cmHasLiteralPrefix(cur, "$<")) {
        ++nestingLevel;
        ++pos;
        continue;
      }
      if (cmHasLiteralPrefix(cur, ">")) {
        --nestingLevel;
        if (nestingLevel == 0) {
          ++pos;
          break;
        }
      }
    }

    // Split this genex from following input.
    cm::string_view genex = input.substr(0, pos);
    input = input.substr(pos);

    // Convert an outer COMMAND_CONFIG or OUTPUT_CONFIG to the matching config.
    std::string const* config =
      useOutputConfig ? &outputConfig : &commandConfig;
    if (nestingLevel == 0) {
      static cm::string_view const COMMAND_CONFIG = "$<COMMAND_CONFIG:"_s;
      static cm::string_view const OUTPUT_CONFIG = "$<OUTPUT_CONFIG:"_s;
      if (cmHasPrefix(genex, COMMAND_CONFIG)) {
        genex.remove_prefix(COMMAND_CONFIG.size());
        genex.remove_suffix(1);
        useOutputConfig = false;
        config = &commandConfig;
      } else if (cmHasPrefix(genex, OUTPUT_CONFIG)) {
        genex.remove_prefix(OUTPUT_CONFIG.size());
        genex.remove_suffix(1);
        useOutputConfig = true;
        config = &outputConfig;
      }
    }

    // Evaluate this genex in the selected configuration.
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(std::string(genex));
    result += cge->Evaluate(lg, *config, target);

    // Record targets referenced by the genex.
    if (utils) {
      // Use a cross-dependency if we referenced the command config.
      bool const cross = !useOutputConfig;
      for (cmGeneratorTarget* gt : cge->GetTargets()) {
        utils->emplace(BT<std::pair<std::string, bool>>(
          { gt->GetName(), cross }, cge->GetBacktrace()));
      }
    }
  }

  return result;
}